

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall google::protobuf::compiler::Version::Clear(Version *this)

{
  uint uVar1;
  uint32_t *puVar2;
  uint32_t cached_has_bits;
  Version *this_local;
  
  puVar2 = internal::HasBits<1UL>::operator[](&this->_has_bits_,0);
  uVar1 = *puVar2;
  if ((uVar1 & 1) != 0) {
    internal::ArenaStringPtr::ClearNonDefaultToEmpty(&this->suffix_);
  }
  if ((uVar1 & 0xe) != 0) {
    memset(&this->major_,0,0xc);
  }
  internal::HasBits<1UL>::Clear(&this->_has_bits_);
  internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

void Version::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.compiler.Version)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000001u) {
    suffix_.ClearNonDefaultToEmpty();
  }
  if (cached_has_bits & 0x0000000eu) {
    ::memset(&major_, 0, static_cast<size_t>(
        reinterpret_cast<char*>(&patch_) -
        reinterpret_cast<char*>(&major_)) + sizeof(patch_));
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>();
}